

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_31::WebSocketImpl::queuePong(WebSocketImpl *this,Array<unsigned_char> *payload)

{
  Array<unsigned_char> *pAVar1;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2467:58),_kj::Array<unsigned_char>_>
  *func;
  Array<unsigned_char> local_98;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  Promise<void> local_30;
  undefined1 local_20 [8];
  Promise<void> *promise;
  Array<unsigned_char> *payload_local;
  WebSocketImpl *this_local;
  
  promise = (Promise<void> *)payload;
  payload_local = (Array<unsigned_char> *)this;
  if ((this->currentlySending & 1U) == 0) {
    func = (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2467:58),_kj::Array<unsigned_char>_>
            *)_::readMaybe<kj::Promise<void>>(&this->sendingPong);
    local_20 = (undefined1  [8])func;
    if (func == (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2467:58),_kj::Array<unsigned_char>_>
                 *)0x0) {
      pAVar1 = mv<kj::Array<unsigned_char>>(payload);
      Array<unsigned_char>::Array(&local_98,pAVar1);
      sendPong((WebSocketImpl *)local_80,(Array<unsigned_char> *)this);
      Maybe<kj::Promise<void>_>::operator=(&this->sendingPong,(Promise<void> *)local_80);
      Promise<void>::~Promise((Promise<void> *)local_80);
      Array<unsigned_char>::~Array(&local_98);
    }
    else {
      local_58._0_8_ = this;
      mvCapture<kj::(anonymous_namespace)::WebSocketImpl::queuePong(kj::Array<unsigned_char>)::_lambda(kj::Array<unsigned_char>)_1_,kj::Array<unsigned_char>&>
                ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2467:58),_kj::Array<unsigned_char>_>
                  *)(local_58 + 8),(kj *)payload,(Array<unsigned_char> *)local_58,(Type *)func);
      Promise<void>::
      then<kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::queuePong(kj::Array<unsigned_char>)::_lambda(kj::Array<unsigned_char>)_1_,kj::Array<unsigned_char>>,kj::_::PropagateException>
                (&local_30,func,(PropagateException *)(local_58 + 8));
      Maybe<kj::Promise<void>_>::operator=(&this->sendingPong,&local_30);
      Promise<void>::~Promise(&local_30);
      CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2467:58),_kj::Array<unsigned_char>_>
      ::~CaptureByMove((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2467:58),_kj::Array<unsigned_char>_>
                        *)(local_58 + 8));
    }
  }
  else {
    pAVar1 = mv<kj::Array<unsigned_char>>(payload);
    Maybe<kj::Array<unsigned_char>_>::operator=(&this->queuedPong,pAVar1);
  }
  return;
}

Assistant:

void queuePong(kj::Array<byte> payload) {
    if (currentlySending) {
      // There is a message-send in progress, so we cannot write to the stream now.
      //
      // Note: According to spec, if the server receives a second ping before responding to the
      //   previous one, it can opt to respond only to the last ping. So we don't have to check if
      //   queuedPong is already non-null.
      queuedPong = kj::mv(payload);
    } else KJ_IF_MAYBE(promise, sendingPong) {
      // We're still sending a previous pong. Wait for it to finish before sending ours.
      sendingPong = promise->then(kj::mvCapture(payload, [this](kj::Array<byte> payload) mutable {
        return sendPong(kj::mv(payload));
      }));
    } else {
      // We're not sending any pong currently.
      sendingPong = sendPong(kj::mv(payload));
    }